

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.h
# Opt level: O2

void __thiscall xemmai::t_object::f_decrement_step(t_object *this)

{
  t_object *ptVar1;
  t_type *ptVar2;
  long in_FS_OFFSET;
  
  f_scan_fields(this,f_push<&xemmai::t_object::f_decrement_push>);
  ptVar2 = this->v_type;
  if (ptVar2->f_finalize != (_func_void_t_object_ptr_t_scan *)0x0) {
    (*ptVar2->f_finalize)(this,f_push<&xemmai::t_object::f_decrement_push>);
    ptVar2 = this->v_type;
  }
  f_decrement_push((t_object *)&ptVar2[-1].f_less);
  this->v_type = (t_type *)0x0;
  ptVar1 = this->v_next;
  if (ptVar1 != (t_object *)0x0) {
    if (this->v_previous == (t_object *)0x0) {
      return;
    }
    ptVar1->v_previous = this->v_previous;
    this->v_previous->v_next = ptVar1;
  }
  t_engine::f_free_as_release(*(t_engine **)(in_FS_OFFSET + -0x60),this);
  return;
}

Assistant:

inline void t_object::f_decrement_step()
{
	f_scan_fields(f_push<&t_object::f_decrement_push>);
	if (v_type->f_finalize) v_type->f_finalize(this, f_push<&t_object::f_decrement_push>);
	t_object::f_of(v_type)->f_decrement_push();
	v_type = nullptr;
	if (v_next) {
		if (!v_previous) return;
		v_next->v_previous = v_previous;
		v_previous->v_next = v_next;
	}
	f_engine()->f_free_as_release(this);
}